

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::senseAuditory(HierarchicalTaskNetworkComponent *this)

{
  Vector2<float> position;
  Stimulus stimulus;
  World *this_00;
  GameMode *this_01;
  SoundMap *this_02;
  mapped_type *pmVar1;
  mapped_type_conflict *pmVar2;
  SoundWave *wave;
  pointer pSVar3;
  float fVar4;
  key_type local_74;
  value_type local_70;
  vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> sounds;
  
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  this_02 = GameMode::getSoundMap(this_01);
  local_70.x = 7.00649e-45;
  pmVar1 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](&(this->state).current.vectors,(key_type *)&local_70);
  position.x = pmVar1->x;
  position.y = pmVar1->y;
  SoundMap::collectSounds(&sounds,this_02,position,10);
  for (pSVar3 = sounds.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar3 != sounds.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
                super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    if (10.0 <= pSVar3->intensity) {
      local_70.type = Auditory;
      local_70._0_8_ = pSVar3->originalPosition;
      local_70.field_3.auditory.tag = (Auditory)pSVar3->tag;
      local_70.intensity = pSVar3->intensity;
      std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::push_back
                (&(this->state).memory.sensoryMemory,&local_70);
      stimulus._36_4_ = local_70._36_4_;
      stimulus.type = local_70.type;
      stimulus._12_4_ = local_70._12_4_;
      stimulus.intensity = local_70.intensity;
      stimulus.field_3._4_4_ = local_70.field_3._4_4_;
      stimulus.field_3.auditory.tag = (Auditory)(Auditory)local_70.field_3.visual.tag;
      stimulus.x = local_70.x;
      stimulus.y = local_70.y;
      stimulus.field_3.visual.target = local_70.field_3.visual.target;
      encodeEngramIfUnique(stimulus,&(this->state).memory.shortTermMemory);
      local_74 = Curiosity;
      pmVar2 = std::
               map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
               ::operator[](&(this->state).current.values,&local_74);
      fVar4 = Math::clamp(local_70.intensity / 10.0 + *pmVar2,0.0,100.0);
      *pmVar2 = fVar4;
    }
  }
  std::_Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>::~_Vector_base
            (&sounds.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::senseAuditory()
{
	auto& soundMap = getWorld()->getAuthGameMode()->getSoundMap();

	auto location = state.current.vectors[WorldStateIdentifier::CurrentPosition];

	auto range = 10.f;
	auto sounds = soundMap.collectSounds({location.x, location.y}, range);
	
	const float MINIMUM_INTENSITY_HACK = 10.f;

	for (auto& wave : sounds)
	{
		if (wave.intensity < MINIMUM_INTENSITY_HACK)
			continue;

		Stimulus stimulus;
		stimulus.type = StimulusType::Auditory;
		stimulus.intensity = wave.intensity;
		stimulus.x = wave.originalPosition.x;
		stimulus.y = wave.originalPosition.y;
		stimulus.auditory.tag = wave.tag;

		state.memory.sensoryMemory.push_back(stimulus);

		encodeEngramIfUnique(stimulus, state.memory.shortTermMemory);

		//auto& alertness = state.current.values[WorldStateIdentifier::Alertness];
		//alertness = FMath::Clamp(alertness + stimulus.auditory.intensity / 100.f, 0.f, 60.f);
		auto& curiosity = state.current.values[WorldStateIdentifier::Curiosity];
		curiosity = clamp(curiosity + stimulus.intensity / 10.f, 0.f, 100.f);
	}	
}